

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void processarg<main::__4>(string *arg,anon_class_64_4_986e26b8 *act,bool mustexist)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  long lVar4;
  DIR *__dirp;
  dirent *pdVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  anon_class_64_4_986e26b8 *this;
  char *pcVar11;
  string fullname;
  string srcname;
  anon_class_64_4_986e26b8 local_1f8;
  bool local_1b8;
  anon_class_64_4_986e26b8 local_1b0;
  string romname;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [10];
  anon_class_64_4_986e26b8 local_b0;
  anon_class_64_4_986e26b8 local_70;
  
  lVar4 = std::__cxx11::string::find((char)arg,0x3d);
  if (lVar4 == -1) {
    if (*(arg->_M_dataplus)._M_p == '@') {
      std::__cxx11::string::substr((ulong)&srcname,(ulong)arg);
      MmapReader::MmapReader((MmapReader *)&romname,&srcname);
      std::__cxx11::string::~string((string *)&srcname);
      main::$_4::__4((__4 *)&local_1f8,act);
      local_1b8 = mustexist;
      lVar4 = (**(code **)(romname._M_dataplus._M_p + 0x30))();
      pcVar7 = (char *)(lVar4 + romname.field_2._M_allocated_capacity);
      pcVar11 = (char *)(local_150[0]._M_allocated_capacity + romname.field_2._M_allocated_capacity)
      ;
      while (pcVar11 < pcVar7) {
        lVar6 = 0;
        lVar4 = 0;
        for (lVar9 = (long)pcVar7 - (long)pcVar11 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
          if ((pcVar11[lVar6 * 4] == '\n') || (pcVar11[lVar6 * 4] == '\r')) {
            pcVar8 = pcVar11 + -lVar4;
            goto LAB_0010d595;
          }
          if ((pcVar11[lVar6 * 4 + 1] == '\n') || (pcVar11[lVar6 * 4 + 1] == '\r')) {
            pcVar8 = pcVar11 + (1 - lVar4);
            goto LAB_0010d595;
          }
          if ((pcVar11[lVar6 * 4 + 2] == '\n') || (pcVar11[lVar6 * 4 + 2] == '\r')) {
            pcVar8 = pcVar11 + (2 - lVar4);
            goto LAB_0010d595;
          }
          if ((pcVar11[lVar6 * 4 + 3] == '\n') || (pcVar11[lVar6 * 4 + 3] == '\r')) {
            pcVar8 = pcVar11 + (3 - lVar4);
            goto LAB_0010d595;
          }
          lVar4 = lVar4 + -4;
          lVar6 = lVar6 + 1;
        }
        pcVar10 = pcVar11 + -lVar4;
        lVar9 = ((long)pcVar7 - (long)pcVar11) + lVar4;
        if (lVar9 == 1) {
LAB_0010d666:
          pcVar8 = pcVar10;
          if ((*pcVar10 != '\n') && (*pcVar10 != '\r')) {
            pcVar8 = pcVar7;
          }
        }
        else if (lVar9 == 3) {
          pcVar8 = pcVar10;
          if ((pcVar11[lVar6 * 4] != '\n') && (pcVar11[lVar6 * 4] != '\r')) {
            pcVar10 = pcVar11 + (1 - lVar4);
            goto LAB_0010d64e;
          }
        }
        else {
          pcVar8 = pcVar7;
          if (lVar9 == 2) {
LAB_0010d64e:
            pcVar8 = pcVar10;
            if ((*pcVar10 != '\n') && (*pcVar10 != '\r')) {
              pcVar10 = pcVar10 + 1;
              goto LAB_0010d666;
            }
          }
        }
LAB_0010d595:
        fullname._M_dataplus._M_p = (pointer)&fullname.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&fullname,pcVar11,pcVar8);
        main::$_4::__4((__4 *)&srcname,&local_1f8);
        processarg<main::__4>(&fullname,(anon_class_64_4_986e26b8 *)&srcname,local_1b8);
        main::$_4::~__4((__4 *)&srcname);
        std::__cxx11::string::~string((string *)&fullname);
        if (pcVar7 <= pcVar8) break;
        while( true ) {
          if (pcVar7 <= pcVar8) goto LAB_0010d7a1;
          if (*pcVar8 != '\r') break;
          pcVar8 = pcVar8 + 1;
        }
        pcVar11 = pcVar8 + (*pcVar8 == '\n');
      }
LAB_0010d7a1:
      main::$_4::~__4((__4 *)&local_1f8);
      MmapReader::~MmapReader((MmapReader *)&romname);
    }
    else {
      iVar3 = GetFileInfo<char>(arg);
      if (iVar3 == 3) {
        main::$_4::__4((__4 *)&local_70,act);
        handlepath<main::__4>(arg,&local_70);
        this = &local_70;
      }
      else if (iVar3 == 2) {
        main::$_4::__4((__4 *)&local_1b0,act);
        __dirp = opendir((arg->_M_dataplus)._M_p);
        if (__dirp != (DIR *)0x0) {
          while (pdVar5 = readdir(__dirp), pdVar5 != (dirent *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&srcname,pdVar5->d_name,(allocator<char> *)&romname);
            bVar1 = std::operator==(&srcname,".");
            if ((!bVar1) && (bVar1 = std::operator==(&srcname,".."), !bVar1)) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &romname,arg,"/");
              std::operator+(&fullname,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &romname,&srcname);
              std::__cxx11::string::~string((string *)&romname);
              uVar2 = pdVar5->d_type;
              if (uVar2 == '\x04') {
                printf("NOTE: not processing subdirectory %s\n",fullname._M_dataplus._M_p);
                uVar2 = pdVar5->d_type;
              }
              if (uVar2 == '\b') {
                main::$_4::__4((__4 *)&romname,&local_1b0);
                handlepath<main::__4>(&fullname,(anon_class_64_4_986e26b8 *)&romname);
                main::$_4::~__4((__4 *)&romname);
              }
              std::__cxx11::string::~string((string *)&fullname);
            }
            std::__cxx11::string::~string((string *)&srcname);
          }
          closedir(__dirp);
        }
        this = &local_1b0;
      }
      else {
        if (mustexist) {
          printf("WARNING: %s does not exist\n",(arg->_M_dataplus)._M_p);
          return;
        }
        main::$_4::__4((__4 *)&local_b0,act);
        handlepath<main::__4>(arg,&local_b0);
        this = &local_b0;
      }
      main::$_4::~__4((__4 *)this);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&romname,(ulong)arg);
    std::__cxx11::string::substr((ulong)&srcname,(ulong)arg);
    main::anon_class_64_4_986e26b8::operator()(act,&srcname,&romname);
    std::__cxx11::string::~string((string *)&srcname);
    std::__cxx11::string::~string((string *)&romname);
  }
  return;
}

Assistant:

void processarg(const std::string& arg, ACTION act, bool mustexist)
{
    size_t ieq= arg.find('=');
    if (ieq!=std::string::npos) {
        //  <rom>=<src>
        std::string romname= arg.substr(0,ieq);
        std::string srcname= arg.substr(ieq+1);
        act(srcname, romname);
    }
    else if (arg[0]=='@') {
        // if name starts with '@' -> read list from file
        MmapReader rl(arg.substr(1), MmapReader::readonly);

        rl.line_enumerator([act,mustexist](const char *first, const char*last)->bool {
            processarg(std::string(first, last-first), act, mustexist);
            return true;
        });
    }
    else switch (GetFileInfo(arg)) {
        case AT_ISDIRECTORY:
            // if <arg> is a directory -> add all files in that directory
            dir_iterator(arg, [act](const std::string& srcpath) {
                    handlepath(srcpath, act);
                },
                [](const std::string& dirname)->bool { printf("NOTE: not processing subdirectory %s\n", dirname.c_str()); return false; }
            );
            break;
        case AT_ISFILE:
            handlepath(arg, act);
            break;
        default:
            if (mustexist)
                printf("WARNING: %s does not exist\n", arg.c_str());
            else
                handlepath(arg, act);
    }
}